

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.hpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::wildcardAllowsNamespace
          (TraverseSchema *this,SchemaAttDef *wildCard,uint nameURI)

{
  AttTypes AVar1;
  ulong uVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  AVar1 = (wildCard->super_XMLAttDef).fType;
  if (AVar1 != Any_Any) {
    if (AVar1 == Any_List) {
      uVar2 = wildCard->fNamespaceList->fCurCount;
      if (uVar2 == 0) {
        return false;
      }
      puVar3 = wildCard->fNamespaceList->fElemList;
      if (*puVar3 != nameURI) {
        uVar4 = 1;
        do {
          uVar5 = uVar4;
          if (uVar2 == uVar5) break;
          uVar4 = uVar5 + 1;
        } while (puVar3[uVar5] != nameURI);
        if (uVar2 <= uVar5) {
          return false;
        }
      }
    }
    else if (((AVar1 != Any_Other) || (this->fEmptyNamespaceURI == nameURI)) ||
            (wildCard->fAttName->fURIId == nameURI)) {
      return false;
    }
  }
  return true;
}

Assistant:

inline XMLAttDef::AttTypes XMLAttDef::getType() const
{
    return fType;
}